

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# two_level_iterator.cc
# Opt level: O0

void __thiscall
leveldb::anon_unknown_7::TwoLevelIterator::SkipEmptyDataBlocksForward(TwoLevelIterator *this)

{
  bool bVar1;
  Iterator *pIVar2;
  long in_FS_OFFSET;
  TwoLevelIterator *unaff_retaddr;
  IteratorWrapper *in_stack_ffffffffffffffd8;
  byte local_19;
  TwoLevelIterator *this_00;
  
  this_00 = *(TwoLevelIterator **)(in_FS_OFFSET + 0x28);
  while( true ) {
    pIVar2 = IteratorWrapper::iter(in_stack_ffffffffffffffd8);
    local_19 = 1;
    if (pIVar2 != (Iterator *)0x0) {
      bVar1 = IteratorWrapper::Valid(in_stack_ffffffffffffffd8);
      local_19 = bVar1 ^ 0xff;
    }
    if ((local_19 & 1) == 0) goto LAB_00d48c9d;
    bVar1 = IteratorWrapper::Valid(in_stack_ffffffffffffffd8);
    if (!bVar1) break;
    IteratorWrapper::Next(in_stack_ffffffffffffffd8);
    InitDataBlock(this_00);
    pIVar2 = IteratorWrapper::iter(in_stack_ffffffffffffffd8);
    if (pIVar2 != (Iterator *)0x0) {
      IteratorWrapper::SeekToFirst(in_stack_ffffffffffffffd8);
    }
  }
  SetDataIterator(unaff_retaddr,&this_00->super_Iterator);
LAB_00d48c9d:
  if (*(TwoLevelIterator **)(in_FS_OFFSET + 0x28) != this_00) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void TwoLevelIterator::SkipEmptyDataBlocksForward() {
  while (data_iter_.iter() == nullptr || !data_iter_.Valid()) {
    // Move to next block
    if (!index_iter_.Valid()) {
      SetDataIterator(nullptr);
      return;
    }
    index_iter_.Next();
    InitDataBlock();
    if (data_iter_.iter() != nullptr) data_iter_.SeekToFirst();
  }
}